

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::IsWindowChildOf
               (ImGuiWindow *window,ImGuiWindow *potential_parent,bool popup_hierarchy,
               bool dock_hierarchy)

{
  ImGuiWindow *pIVar1;
  ImGuiWindow *window_root;
  bool dock_hierarchy_local;
  bool popup_hierarchy_local;
  ImGuiWindow *potential_parent_local;
  ImGuiWindow *window_local;
  
  pIVar1 = GetCombinedRootWindow(window,popup_hierarchy,dock_hierarchy);
  potential_parent_local = window;
  if (pIVar1 == potential_parent) {
    window_local._7_1_ = true;
  }
  else {
    for (; potential_parent_local != (ImGuiWindow *)0x0;
        potential_parent_local = potential_parent_local->ParentWindow) {
      if (potential_parent_local == potential_parent) {
        return true;
      }
      if (potential_parent_local == pIVar1) {
        return false;
      }
    }
    window_local._7_1_ = false;
  }
  return window_local._7_1_;
}

Assistant:

bool ImGui::IsWindowChildOf(ImGuiWindow* window, ImGuiWindow* potential_parent, bool popup_hierarchy, bool dock_hierarchy)
{
    ImGuiWindow* window_root = GetCombinedRootWindow(window, popup_hierarchy, dock_hierarchy);
    if (window_root == potential_parent)
        return true;
    while (window != NULL)
    {
        if (window == potential_parent)
            return true;
        if (window == window_root) // end of chain
            return false;
        window = window->ParentWindow;
    }
    return false;
}